

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtransaction.cpp
# Opt level: O0

void __thiscall
ConfidentialTransaction_GetPegoutPubkeyDataTest_Test::TestBody
          (ConfidentialTransaction_GetPegoutPubkeyDataTest_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  AssertHelper local_5d8;
  Message local_5d0;
  string local_5c8;
  undefined1 local_5a8 [8];
  AssertionResult gtest_ar_3;
  Address pegout_addr;
  Message local_418;
  string local_410;
  undefined1 local_3f0 [8];
  AssertionResult gtest_ar_2;
  Message local_3d8;
  string local_3d0;
  undefined1 local_3b0 [8];
  AssertionResult gtest_ar_1;
  Message local_398;
  string local_390;
  undefined1 local_370 [8];
  AssertionResult gtest_ar;
  Message local_358 [2];
  PegoutKeyData local_348;
  reference local_318;
  GetPegoutPubkeyDataTestVector *testdata;
  const_iterator __end1;
  const_iterator __begin1;
  vector<GetPegoutPubkeyDataTestVector,_std::allocator<GetPegoutPubkeyDataTestVector>_> *__range1;
  Address addr;
  PegoutKeyData key_data;
  uint32_t bip32_counter;
  undefined1 local_128 [8];
  ByteData pubkey_prefix;
  NetType net_type;
  undefined1 local_e8 [8];
  ByteData whitelist;
  undefined1 local_c8 [8];
  string bitcoin_descriptor;
  string local_a0;
  undefined1 local_80 [8];
  Privkey master_online_key;
  allocator local_49;
  string local_48;
  undefined1 local_28 [8];
  Pubkey online_pubkey;
  ConfidentialTransaction_GetPegoutPubkeyDataTest_Test *this_local;
  
  online_pubkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_48,
             "02a71e193ce21075d0966be16724e41fff666366d7ac13e3616a329005da4024da",&local_49);
  cfd::core::Pubkey::Pubkey((Pubkey *)local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_a0,"cPoefvB147bYpWCf9JqRBVMXENt4isSBAn91RYeiBh1jUp3ThhKN",
             (allocator *)(bitcoin_descriptor.field_2._M_local_buf + 0xf));
  cfd::core::Privkey::FromWif((Privkey *)local_80,&local_a0,kTestnet,true);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator
            ((allocator<char> *)(bitcoin_descriptor.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_c8,
             "sh(wpkh(tpubDBwZbsX7C1m4tfHxHSFBvvuasqMxzMvSNM5yuAWz6kAfCATAgegvrtGdnxkqfr8wwRZi5d9fJHXqE8EFTSogTXd3xVx3GUFy9Xcg8dufREz/0/*))"
             ,(allocator *)
              ((long)&whitelist.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&whitelist.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&net_type,
             "020061b08c4c80dc04aaa0b44018d2c4bcdb0d9c0992fb4fddf9d2fb096a5164c002a71e193ce21075d0966be16724e41fff666366d7ac13e3616a329005da4024da"
             ,(allocator *)
              ((long)&pubkey_prefix.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::ByteData::ByteData((ByteData *)local_e8,(string *)&net_type);
  std::__cxx11::string::~string((string *)&net_type);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&pubkey_prefix.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  pubkey_prefix.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = kTestnet;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&bip32_counter,"043587cf",
             (allocator *)
             ((long)&key_data.whitelist_proof.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::ByteData::ByteData((ByteData *)local_128,(string *)&bip32_counter);
  std::__cxx11::string::~string((string *)&bip32_counter);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&key_data.whitelist_proof.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  key_data.whitelist_proof.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  cfd::core::PegoutKeyData::PegoutKeyData
            ((PegoutKeyData *)
             &addr.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  cfd::core::Address::Address((Address *)&__range1);
  __end1 = std::
           vector<GetPegoutPubkeyDataTestVector,_std::allocator<GetPegoutPubkeyDataTestVector>_>::
           begin(&kGetPegoutPubkeyDataTestVector);
  testdata = (GetPegoutPubkeyDataTestVector *)
             std::
             vector<GetPegoutPubkeyDataTestVector,_std::allocator<GetPegoutPubkeyDataTestVector>_>::
             end(&kGetPegoutPubkeyDataTestVector);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_GetPegoutPubkeyDataTestVector_*,_std::vector<GetPegoutPubkeyDataTestVector,_std::allocator<GetPegoutPubkeyDataTestVector>_>_>
                                     *)&testdata), bVar1) {
    local_318 = __gnu_cxx::
                __normal_iterator<const_GetPegoutPubkeyDataTestVector_*,_std::vector<GetPegoutPubkeyDataTestVector,_std::allocator<GetPegoutPubkeyDataTestVector>_>_>
                ::operator*(&__end1);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      bVar1 = testing::internal::AlwaysTrue();
      if (bVar1) {
        cfd::core::ConfidentialTransaction::GetPegoutPubkeyData
                  (&local_348,(Pubkey *)local_28,(Privkey *)local_80,(string *)local_c8,
                   (uint32_t)
                   key_data.whitelist_proof.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage,(ByteData *)local_e8,
                   (NetType)pubkey_prefix.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,(ByteData *)local_128,
                   kElementsRegtest,(Address *)&__range1);
        cfd::core::PegoutKeyData::operator=
                  ((PegoutKeyData *)
                   &addr.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   &local_348);
        cfd::core::PegoutKeyData::~PegoutKeyData(&local_348);
      }
    }
    else {
      testing::Message::Message(local_358);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
                 ,0x789,
                 "Expected: (key_data = ConfidentialTransaction::GetPegoutPubkeyData( online_pubkey, master_online_key, bitcoin_descriptor, bip32_counter, whitelist, net_type, pubkey_prefix, NetType::kElementsRegtest, &addr)) doesn\'t throw an exception.\n  Actual: it throws."
                );
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar.message_,local_358);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
      testing::Message::~Message(local_358);
    }
    cfd::core::Pubkey::GetHex_abi_cxx11_
              (&local_390,
               (Pubkey *)&addr.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::CmpHelperSTREQ
              ((internal *)local_370,"key_data.btc_pubkey_bytes.GetHex().c_str()",
               "testdata.btc_pubkey_bytes.c_str()",pcVar2,pcVar3);
    std::__cxx11::string::~string((string *)&local_390);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_370);
    if (!bVar1) {
      testing::Message::Message(&local_398);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_370);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
                 ,0x78c,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_398);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
      testing::Message::~Message(&local_398);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_370);
    cfd::core::ByteData::GetHex_abi_cxx11_
              (&local_3d0,
               (ByteData *)
               ((long)&key_data.btc_pubkey_bytes.data_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data + 0x10));
    pcVar2 = (char *)std::__cxx11::string::c_str();
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::CmpHelperSTREQ
              ((internal *)local_3b0,"key_data.whitelist_proof.GetHex().c_str()",
               "testdata.whitelist_proof.c_str()",pcVar2,pcVar3);
    std::__cxx11::string::~string((string *)&local_3d0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3b0);
    if (!bVar1) {
      testing::Message::Message(&local_3d8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3b0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
                 ,0x78f,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_3d8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_3d8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_3b0);
    cfd::core::Address::GetAddress_abi_cxx11_(&local_410,(Address *)&__range1);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::CmpHelperSTREQ
              ((internal *)local_3f0,"addr.GetAddress().c_str()","testdata.address.c_str()",pcVar2,
               pcVar3);
    std::__cxx11::string::~string((string *)&local_410);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3f0);
    if (!bVar1) {
      testing::Message::Message(&local_418);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3f0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)
                 &pegout_addr.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
                 ,0x792,pcVar2);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)
                 &pegout_addr.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 &local_418);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)
                 &pegout_addr.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count);
      testing::Message::~Message(&local_418);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_3f0);
    cfd::core::ConfidentialTransaction::GetPegoutAddressFromDescriptor
              ((Address *)&gtest_ar_3.message_,(string *)local_c8,
               (uint32_t)
               key_data.whitelist_proof.data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage,
               (NetType)pubkey_prefix.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,kElementsRegtest);
    cfd::core::Address::GetAddress_abi_cxx11_(&local_5c8,(Address *)&gtest_ar_3.message_);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::CmpHelperSTREQ
              ((internal *)local_5a8,"pegout_addr.GetAddress().c_str()","testdata.address.c_str()",
               pcVar2,pcVar3);
    std::__cxx11::string::~string((string *)&local_5c8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5a8);
    if (!bVar1) {
      testing::Message::Message(&local_5d0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_5a8);
      testing::internal::AssertHelper::AssertHelper
                (&local_5d8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
                 ,0x799,pcVar2);
      testing::internal::AssertHelper::operator=(&local_5d8,&local_5d0);
      testing::internal::AssertHelper::~AssertHelper(&local_5d8);
      testing::Message::~Message(&local_5d0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_5a8);
    key_data.whitelist_proof.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
         (uint32_t)
         key_data.whitelist_proof.data_.
         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage + 1;
    cfd::core::Address::~Address((Address *)&gtest_ar_3.message_);
    __gnu_cxx::
    __normal_iterator<const_GetPegoutPubkeyDataTestVector_*,_std::vector<GetPegoutPubkeyDataTestVector,_std::allocator<GetPegoutPubkeyDataTestVector>_>_>
    ::operator++(&__end1);
  }
  cfd::core::Address::~Address((Address *)&__range1);
  cfd::core::PegoutKeyData::~PegoutKeyData
            ((PegoutKeyData *)
             &addr.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  cfd::core::ByteData::~ByteData((ByteData *)local_128);
  cfd::core::ByteData::~ByteData((ByteData *)local_e8);
  std::__cxx11::string::~string((string *)local_c8);
  cfd::core::Privkey::~Privkey((Privkey *)local_80);
  cfd::core::Pubkey::~Pubkey((Pubkey *)local_28);
  return;
}

Assistant:

TEST(ConfidentialTransaction, GetPegoutPubkeyDataTest) {
  // liquid_pak
  Pubkey online_pubkey("02a71e193ce21075d0966be16724e41fff666366d7ac13e3616a329005da4024da");
  // liquid_pak_privkey
  Privkey master_online_key = Privkey::FromWif(
      "cPoefvB147bYpWCf9JqRBVMXENt4isSBAn91RYeiBh1jUp3ThhKN", NetType::kTestnet, true);
  std::string bitcoin_descriptor = "sh(wpkh(tpubDBwZbsX7C1m4tfHxHSFBvvuasqMxzMvSNM5yuAWz6kAfCATAgegvrtGdnxkqfr8wwRZi5d9fJHXqE8EFTSogTXd3xVx3GUFy9Xcg8dufREz/0/*))";
  ByteData whitelist("020061b08c4c80dc04aaa0b44018d2c4bcdb0d9c0992fb4fddf9d2fb096a5164c002a71e193ce21075d0966be16724e41fff666366d7ac13e3616a329005da4024da");
  NetType net_type = NetType::kTestnet;
  ByteData pubkey_prefix = ByteData("043587cf");
  uint32_t bip32_counter = 0;
  PegoutKeyData key_data;

  Address addr;
  for (const auto& testdata : kGetPegoutPubkeyDataTestVector) {
    EXPECT_NO_THROW(
      (key_data = ConfidentialTransaction::GetPegoutPubkeyData(
          online_pubkey, master_online_key, bitcoin_descriptor, bip32_counter,
          whitelist, net_type, pubkey_prefix, NetType::kElementsRegtest, &addr)));
    EXPECT_STREQ(
        key_data.btc_pubkey_bytes.GetHex().c_str(),
        testdata.btc_pubkey_bytes.c_str());
    EXPECT_STREQ(
        key_data.whitelist_proof.GetHex().c_str(),
        testdata.whitelist_proof.c_str());
    EXPECT_STREQ(
        addr.GetAddress().c_str(),
        testdata.address.c_str());

    auto pegout_addr = ConfidentialTransaction::GetPegoutAddressFromDescriptor(
        bitcoin_descriptor, bip32_counter, net_type,
        NetType::kElementsRegtest);
    EXPECT_STREQ(
        pegout_addr.GetAddress().c_str(),
        testdata.address.c_str());
    ++bip32_counter;
  }
}